

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-alloc-cb-fail.c
# Opt level: O2

void conn_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  char *pcVar1;
  undefined8 uStack_10;
  
  if (nread == -0x69) {
    if (buf->base == (char *)0x0) {
      if (buf->len == 0) {
        uv_close((uv_handle_t *)&incoming,close_cb);
        uv_close((uv_handle_t *)&client,close_cb);
        uv_close((uv_handle_t *)&server,close_cb);
        return;
      }
      pcVar1 = "buf->len == 0";
      uStack_10 = 0x39;
    }
    else {
      pcVar1 = "buf->base == NULL";
      uStack_10 = 0x38;
    }
  }
  else {
    pcVar1 = "nread == UV_ENOBUFS";
    uStack_10 = 0x37;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-alloc-cb-fail.c"
          ,uStack_10,pcVar1);
  abort();
}

Assistant:

static void conn_read_cb(uv_stream_t* stream,
                         ssize_t nread,
                         const uv_buf_t* buf) {
  ASSERT(nread == UV_ENOBUFS);
  ASSERT(buf->base == NULL);
  ASSERT(buf->len == 0);

  uv_close((uv_handle_t*) &incoming, close_cb);
  uv_close((uv_handle_t*) &client, close_cb);
  uv_close((uv_handle_t*) &server, close_cb);
}